

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  int iVar2;
  undefined8 in_RAX;
  stbi_uc *psVar3;
  long lVar4;
  char *pcVar5;
  long *in_FS_OFFSET;
  bool bVar6;
  char c;
  undefined8 uStack_38;
  
  psVar3 = s->img_buffer_original;
  s->img_buffer = psVar3;
  s->img_buffer_end = s->img_buffer_original_end;
  uStack_38 = in_RAX;
  if (psVar3 < s->img_buffer_original_end) {
LAB_004569a1:
    s->img_buffer = psVar3 + 1;
    bVar6 = *psVar3 != 'P';
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      psVar3 = s->img_buffer;
      goto LAB_004569a1;
    }
    bVar6 = true;
  }
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_00456a2d:
    s->img_buffer = psVar3 + 1;
    sVar1 = *psVar3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      psVar3 = s->img_buffer;
      goto LAB_00456a2d;
    }
    sVar1 = '\0';
  }
  if (!(bool)(~bVar6 & 0xfd < (byte)(sVar1 - 0x37))) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    return 0;
  }
  if (comp != (int *)0x0) {
    *comp = (uint)(sVar1 == '6') * 2 + 1;
  }
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_00456aef:
    s->img_buffer = psVar3 + 1;
    sVar1 = *psVar3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar3 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar3;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar3;
        s->img_buffer_end = psVar3 + iVar2;
      }
      psVar3 = s->img_buffer;
      goto LAB_00456aef;
    }
    sVar1 = '\0';
  }
  uStack_38 = CONCAT17(sVar1,(undefined7)uStack_38);
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (x != (int *)0x0) {
    *x = iVar2;
  }
  if (iVar2 != 0) {
    stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
    iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
    if (y != (int *)0x0) {
      *y = iVar2;
    }
    if (iVar2 != 0) {
      stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
      iVar2 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
      if (iVar2 < 0x10000) {
        return (uint)(0xff < iVar2) * 8 + 8;
      }
      lVar4 = *in_FS_OFFSET;
      pcVar5 = "max value > 65535";
      goto LAB_00456b98;
    }
  }
  lVar4 = *in_FS_OFFSET;
  pcVar5 = "invalid width";
LAB_00456b98:
  *(char **)(lVar4 + -8) = pcVar5;
  return 0;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   if(*x == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   if (*y == 0)
       return stbi__err("invalid width", "PPM image header had zero or overflowing width");
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value
   if (maxv > 65535)
      return stbi__err("max value > 65535", "PPM image supports only 8-bit and 16-bit images");
   else if (maxv > 255)
      return 16;
   else
      return 8;
}